

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O3

string * __thiscall
antlr::MismatchedCharException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,MismatchedCharException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  int in_EDX;
  int extraout_EDX;
  int ch;
  int extraout_EDX_00;
  int ch_00;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> elems;
  string local_160;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  string local_120;
  string *local_100;
  undefined1 local_f8 [24];
  undefined8 uStack_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  MismatchedCharException *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_100 = __return_storage_ptr__;
  switch(this->mismatchType) {
  case 1:
    charName_abi_cxx11_(&local_d8,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x251466);
    plVar4 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4) {
      local_f8._16_8_ = *plVar4;
      uStack_e0 = puVar5[3];
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_f8 + 0x10);
    }
    else {
      local_f8._16_8_ = *plVar4;
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar5;
    }
    local_f8._8_8_ = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append(local_f8);
    paVar1 = &local_120.field_2;
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_120.field_2._M_allocated_capacity = *puVar7;
      local_120.field_2._8_8_ = puVar5[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar7;
      local_120._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_120._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    charName_abi_cxx11_(&local_b8,(antlr *)(ulong)(uint)this->foundChar,
                        (int)local_120._M_string_length);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      uVar10 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_b8._M_string_length + local_120._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar10 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_b8._M_string_length + local_120._M_string_length) goto LAB_00178f84;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_00178f84:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_b8._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_130 = *plVar4;
      lStack_128 = puVar5[3];
    }
    else {
      local_130 = *plVar4;
      local_140 = (long *)*puVar5;
    }
    local_138 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160.field_2._8_8_ = puVar5[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_160._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    local_50.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return local_100;
    }
    break;
  case 2:
    charName_abi_cxx11_(&local_120,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x25147d);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_130 = *plVar4;
      lStack_128 = puVar5[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar4;
      local_140 = (long *)*puVar5;
    }
    local_138 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160.field_2._8_8_ = puVar5[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_160._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_120._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == &local_120.field_2) {
      return local_100;
    }
    break;
  case 3:
    charName_abi_cxx11_(&local_50,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2514a7);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    puVar7 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_b8.field_2._M_allocated_capacity = *puVar7;
      local_b8.field_2._8_8_ = plVar4[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar7;
      local_b8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b8._M_string_length = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_d8.field_2._M_allocated_capacity = *puVar7;
      local_d8.field_2._8_8_ = puVar5[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *puVar7;
      local_d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_d8._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    charName_abi_cxx11_(&local_78,(antlr *)(ulong)(uint)this->upper,(int)local_d8._M_string_length);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar10 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_78._M_string_length + local_d8._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar10 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_78._M_string_length + local_d8._M_string_length) goto LAB_00178e48;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_78,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
    }
    else {
LAB_00178e48:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78._M_dataplus._M_p);
    }
    local_f8._0_8_ = local_f8 + 0x10;
    plVar4 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4) {
      local_f8._16_8_ = *plVar4;
      uStack_e0 = puVar5[3];
    }
    else {
      local_f8._16_8_ = *plVar4;
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar5;
    }
    local_f8._8_8_ = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append(local_f8);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_120.field_2._M_allocated_capacity = *puVar7;
      local_120.field_2._8_8_ = puVar5[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar7;
      local_120._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_120._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    charName_abi_cxx11_(&local_98,(antlr *)(ulong)(uint)this->foundChar,
                        (int)local_120._M_string_length);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar10 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_98._M_string_length + local_120._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar10 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_98._M_string_length + local_120._M_string_length) goto LAB_00179126;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_00179126:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_98._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_130 = *plVar4;
      lStack_128 = puVar5[3];
    }
    else {
      local_130 = *plVar4;
      local_140 = (long *)*puVar5;
    }
    local_138 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160.field_2._8_8_ = puVar5[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_160._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
    goto LAB_00179555;
  case 4:
    charName_abi_cxx11_(&local_50,(antlr *)(ulong)(uint)this->expecting,in_EDX);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2514c8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_b8.field_2._M_allocated_capacity = *puVar7;
      local_b8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar7;
      local_b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_b8._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_d8.field_2._M_allocated_capacity = *puVar7;
      local_d8.field_2._8_8_ = puVar5[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *puVar7;
      local_d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_d8._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    charName_abi_cxx11_(&local_78,(antlr *)(ulong)(uint)this->upper,(int)local_d8._M_string_length);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar10 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_78._M_string_length + local_d8._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar10 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_78._M_string_length + local_d8._M_string_length) goto LAB_00178eec;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_78,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
    }
    else {
LAB_00178eec:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78._M_dataplus._M_p);
    }
    local_f8._0_8_ = local_f8 + 0x10;
    plVar4 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4) {
      local_f8._16_8_ = *plVar4;
      uStack_e0 = puVar5[3];
    }
    else {
      local_f8._16_8_ = *plVar4;
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar5;
    }
    local_f8._8_8_ = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append(local_f8);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_120.field_2._M_allocated_capacity = *puVar7;
      local_120.field_2._8_8_ = puVar5[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar7;
      local_120._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_120._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    charName_abi_cxx11_(&local_98,(antlr *)(ulong)(uint)this->foundChar,
                        (int)local_120._M_string_length);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar10 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_98._M_string_length + local_120._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar10 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_98._M_string_length + local_120._M_string_length) goto LAB_00179251;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_00179251:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_98._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_130 = *plVar4;
      lStack_128 = puVar5[3];
    }
    else {
      local_130 = *plVar4;
      local_140 = (long *)*puVar5;
    }
    local_138 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160.field_2._8_8_ = puVar5[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_160._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
LAB_00179555:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return local_100;
    }
    break;
  case 5:
  case 6:
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"expecting ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_130 = *plVar6;
      lStack_128 = plVar4[3];
    }
    else {
      local_130 = *plVar6;
      local_140 = (long *)*plVar4;
    }
    local_138 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_58 = this;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_140);
    paVar1 = &local_160.field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_160.field_2._M_allocated_capacity = *psVar8;
      local_160.field_2._8_8_ = plVar4[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar8;
      local_160._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_160._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    BitSet::toArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,&local_58->set);
    ch_00 = extraout_EDX;
    if (local_f8._8_8_ != local_f8._0_8_) {
      uVar9 = 0;
      uVar11 = 1;
      do {
        std::__cxx11::string::append((char *)local_100);
        charName_abi_cxx11_(&local_160,(antlr *)(ulong)*(uint *)(local_f8._0_8_ + uVar9 * 4),ch);
        std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar1) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)local_100);
        bVar3 = uVar11 < (ulong)((long)(local_f8._8_8_ - local_f8._0_8_) >> 2);
        uVar9 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
        ch_00 = extraout_EDX_00;
      } while (bVar3);
    }
    charName_abi_cxx11_(&local_120,(antlr *)(ulong)(uint)local_58->foundChar,ch_00);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x251500);
    local_140 = &local_130;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_130 = *plVar4;
      lStack_128 = puVar5[3];
    }
    else {
      local_130 = *plVar4;
      local_140 = (long *)*puVar5;
    }
    local_138 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160.field_2._8_8_ = puVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_160._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return local_100;
    }
    uVar9 = local_f8._16_8_ - local_f8._0_8_;
    local_50._M_dataplus._M_p = (pointer)local_f8._0_8_;
    goto LAB_00179657;
  default:
    pcVar2 = (this->super_RecognitionException).super_ANTLRException.text._M_dataplus._M_p;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar2,
               pcVar2 + (this->super_RecognitionException).super_ANTLRException.text.
                        _M_string_length);
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_160._M_dataplus._M_p);
    local_50.field_2._M_allocated_capacity = local_160.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_160._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == &local_160.field_2) {
      return local_100;
    }
  }
  uVar9 = local_50.field_2._M_allocated_capacity + 1;
LAB_00179657:
  operator_delete(local_50._M_dataplus._M_p,uVar9);
  return local_100;
}

Assistant:

string MismatchedCharException::getMessage() const
{
	ANTLR_USE_NAMESPACE(std)string s;

	switch (mismatchType) {
	case CHAR :
		s += "expecting '" + charName(expecting) + "', found '" + charName(foundChar) + "'";
		break;
	case NOT_CHAR :
		s += "expecting anything but '" + charName(expecting) + "'; got it anyway";
		break;
	case RANGE :
		s += "expecting token in range: '" + charName(expecting) + "'..'" + charName(upper) + "', found '" + charName(foundChar) + "'";
		break;
	case NOT_RANGE :
		s += "expecting token NOT in range: " + charName(expecting) + "'..'" + charName(upper) + "', found '" + charName(foundChar) + "'";
		break;
	case SET :
	case NOT_SET :
		{
			s += ANTLR_USE_NAMESPACE(std)string("expecting ") + (mismatchType == NOT_SET ? "NOT " : "") + "one of (";
			ANTLR_USE_NAMESPACE(std)vector<unsigned int> elems = set.toArray();
			for ( unsigned int i = 0; i < elems.size(); i++ )
			{
				s += " '";
				s += charName(elems[i]);
				s += "'";
			}
			s += "), found '" + charName(foundChar) + "'";
		}
		break;
	default :
		s += RecognitionException::getMessage();
		break;
	}

	return s;
}